

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

void __thiscall soplex::SVectorBase<double>::sort(SVectorBase<double> *this)

{
  Nonzero<double> *pNVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  Nonzero<double> *pNVar5;
  long lVar6;
  Nonzero<double> *s;
  long lVar7;
  Nonzero<double> *pNVar8;
  long lVar9;
  
  pNVar5 = this->m_elem;
  if (pNVar5 != (Nonzero<double> *)0x0) {
    iVar3 = this->memused;
    lVar7 = 0x10;
    pNVar8 = pNVar5;
    while (pNVar1 = pNVar8 + 1, pNVar1 < pNVar5 + iVar3) {
      iVar4 = pNVar8[1].idx;
      if (iVar4 < pNVar8->idx) {
        dVar2 = pNVar1->val;
        lVar6 = lVar7;
        do {
          lVar9 = lVar6;
          *(undefined4 *)((long)&pNVar5->idx + lVar9) = *(undefined4 *)((long)pNVar5 + lVar9 + -8);
          *(undefined8 *)((long)&pNVar5->val + lVar9) =
               *(undefined8 *)((long)&pNVar5[-1].val + lVar9);
          pNVar8 = pNVar5;
          if (lVar9 == 0x10) goto LAB_001c7d92;
          lVar6 = lVar9 + -0x10;
        } while (iVar4 < *(int *)((long)pNVar5 + lVar9 + -0x18));
        pNVar8 = (Nonzero<double> *)((long)&pNVar5[-1].val + lVar9);
LAB_001c7d92:
        pNVar8->val = dVar2;
        pNVar8->idx = iVar4;
      }
      lVar7 = lVar7 + 0x10;
      pNVar8 = pNVar1;
    }
  }
  return;
}

Assistant:

void sort()
   {
      if(m_elem != nullptr)
      {
         Nonzero<R> dummy;
         Nonzero<R>* w;
         Nonzero<R>* l;
         Nonzero<R>* s = &(m_elem[0]);
         Nonzero<R>* e = s + size();

         for(l = s, w = s + 1; w < e; l = w, ++w)
         {
            if(l->idx > w->idx)
            {
               dummy = *w;

               do
               {
                  l[1] = *l;

                  if(l-- == s)
                     break;
               }
               while(l->idx > dummy.idx);

               l[1] = dummy;
            }
         }
      }
   }